

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O1

nng_err nng_http_copy_body(nng_http *conn,void *data,size_t len)

{
  nng_err nVar1;
  
  nVar1 = nni_http_copy_body(conn,data,len);
  return nVar1;
}

Assistant:

nng_err
nng_http_copy_body(nng_http *conn, const void *data, size_t len)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_copy_body(conn, data, len));
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(data);
	NNI_ARG_UNUSED(len);
	return (NNG_ENOTSUP);
#endif
}